

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::EvalContext::Frame>::
emplaceRealloc<slang::ast::EvalContext::Frame>
          (SmallVectorBase<slang::ast::EvalContext::Frame> *this,pointer pos,Frame *args)

{
  ulong uVar1;
  SubroutineSymbol *pSVar2;
  SourceLocation SVar3;
  undefined8 uVar4;
  pointer pFVar5;
  size_type sVar6;
  _Rb_tree_header *this_00;
  EVP_PKEY_CTX *__x;
  long lVar7;
  SubroutineSymbol **ppSVar8;
  pointer pFVar9;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  pFVar5 = (pointer)detail::allocArray(capacity,0x50);
  __x = (EVP_PKEY_CTX *)&(args->temporaries)._M_t._M_impl.super__Rb_tree_header;
  std::_Rb_tree_header::_Rb_tree_header
            ((_Rb_tree_header *)((long)pFVar5 + lVar7 + 8),(_Rb_tree_header *)__x);
  pSVar2 = args->subroutine;
  SVar3 = args->callLocation;
  uVar4 = *(undefined8 *)((long)&(args->lookupLocation).scope + 4);
  *(undefined8 *)((long)pFVar5 + lVar7 + 0x3c) = *(undefined8 *)&(args->callLocation).field_0x4;
  *(undefined8 *)((long)pFVar5 + lVar7 + 0x44) = uVar4;
  *(SubroutineSymbol **)((long)pFVar5 + lVar7 + 0x30) = pSVar2;
  *(SourceLocation *)((long)pFVar5 + lVar7 + 0x38) = SVar3;
  pFVar9 = this->data_;
  sVar6 = this->len;
  if (pFVar9 + sVar6 == pos) {
    if (sVar6 != 0) {
      ppSVar8 = &pFVar5->subroutine;
      do {
        __x = (EVP_PKEY_CTX *)&(pFVar9->temporaries)._M_t._M_impl.super__Rb_tree_header;
        std::_Rb_tree_header::_Rb_tree_header
                  ((_Rb_tree_header *)(ppSVar8 + -5),(_Rb_tree_header *)__x);
        pSVar2 = pFVar9->subroutine;
        SVar3 = pFVar9->callLocation;
        uVar4 = *(undefined8 *)((long)&(pFVar9->lookupLocation).scope + 4);
        *(undefined8 *)((long)ppSVar8 + 0xc) = *(undefined8 *)&(pFVar9->callLocation).field_0x4;
        *(undefined8 *)((long)ppSVar8 + 0x14) = uVar4;
        *ppSVar8 = pSVar2;
        *(SourceLocation *)(ppSVar8 + 1) = SVar3;
        pFVar9 = pFVar9 + 1;
        ppSVar8 = ppSVar8 + 10;
      } while (pFVar9 != pos);
    }
  }
  else {
    if (pFVar9 != pos) {
      ppSVar8 = &pFVar5->subroutine;
      do {
        __x = (EVP_PKEY_CTX *)&(pFVar9->temporaries)._M_t._M_impl.super__Rb_tree_header;
        std::_Rb_tree_header::_Rb_tree_header
                  ((_Rb_tree_header *)(ppSVar8 + -5),(_Rb_tree_header *)__x);
        pSVar2 = pFVar9->subroutine;
        SVar3 = pFVar9->callLocation;
        uVar4 = *(undefined8 *)((long)&(pFVar9->lookupLocation).scope + 4);
        *(undefined8 *)((long)ppSVar8 + 0xc) = *(undefined8 *)&(pFVar9->callLocation).field_0x4;
        *(undefined8 *)((long)ppSVar8 + 0x14) = uVar4;
        *ppSVar8 = pSVar2;
        *(SourceLocation *)(ppSVar8 + 1) = SVar3;
        pFVar9 = pFVar9 + 1;
        ppSVar8 = ppSVar8 + 10;
      } while (pFVar9 != pos);
      pFVar9 = this->data_;
      sVar6 = this->len;
    }
    if (pFVar9 + sVar6 != pos) {
      this_00 = (_Rb_tree_header *)((long)pFVar5 + lVar7 + 0x58);
      do {
        __x = (EVP_PKEY_CTX *)&(pos->temporaries)._M_t._M_impl.super__Rb_tree_header;
        std::_Rb_tree_header::_Rb_tree_header(this_00,(_Rb_tree_header *)__x);
        pSVar2 = pos->subroutine;
        SVar3 = pos->callLocation;
        uVar4 = *(undefined8 *)((long)&(pos->lookupLocation).scope + 4);
        *(undefined8 *)((long)&this_00[1]._M_header._M_parent + 4) =
             *(undefined8 *)&(pos->callLocation).field_0x4;
        *(undefined8 *)((long)&this_00[1]._M_header._M_left + 4) = uVar4;
        *(SubroutineSymbol **)&this_00[1]._M_header = pSVar2;
        this_00[1]._M_header._M_parent = (_Base_ptr)SVar3;
        pos = pos + 1;
        this_00 = this_00 + 2;
      } while (pos != pFVar9 + sVar6);
    }
  }
  cleanup(this,__x);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pFVar5;
  return (pointer)((long)pFVar5 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}